

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O3

size_t utf8_ptr::s_trunc(char *p,size_t len)

{
  byte bVar1;
  byte *pbVar2;
  size_t sVar3;
  uint ch;
  
  sVar3 = 0;
  if ((len != 0) &&
     (pbVar2 = (byte *)(p + (len - 1)),
     pbVar2 = pbVar2 + -(ulong)(~(uint)(*pbVar2 >> 6) & (uint)(*pbVar2 >> 7)),
     bVar1 = pbVar2[-(ulong)(~(uint)(*pbVar2 >> 6) & (uint)(*pbVar2 >> 7))],
     sVar3 = (long)(pbVar2 + -(ulong)(~(uint)(*pbVar2 >> 6) & (uint)(*pbVar2 >> 7))) - (long)p,
     (ulong)((((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1) <= len - sVar3)) {
    sVar3 = len;
  }
  return sVar3;
}

Assistant:

static size_t s_trunc(const char *p, size_t len)
    {
        /* 
         *   if the length is zero, no adjustment is needed - you
         *   obviously can't divide zero bytes 
         */
        if (len == 0)
            return 0;

        /* 
         *   Get a pointer to the start of the last byte within the
         *   proposed truncated byte region.  Note that the last byte in
         *   the buffer is at index (len-1), since the byte at index (len)
         *   is the next byte after the truncated region.  
         */
        const char *last_ch = p + len - 1;

        /* 
         *   Decrement this byte pointer until we get to the start of the
         *   character that contains the final byte.  Since a character
         *   can never be more than three bytes long, we need decrement
         *   our pointer a maximum of two times.  
         */
        last_ch -= s_is_continuation(last_ch);
        last_ch -= s_is_continuation(last_ch);

        /* 
         *   figure the number of bytes of the last character that are
         *   actually in the truncated region - this is simply the number
         *   of bytes from where we are now to the end of the region 
         */
        size_t last_ch_len = len - (last_ch - p);

        /*
         *   Now compute the actual size of this last character.  If the
         *   last character's actual size is the same as the truncated
         *   size, then the last character fits exactly and we can return
         *   the proposed length unchanged.  If the last character's
         *   required length is more than the truncated length, it means
         *   that the truncation has cut off the last character so that
         *   not all of its bytes fit, and hence we cannot include ANY of
         *   the last character's bytes in the result. 
         */
        if (last_ch_len >= s_charsize(*last_ch))
        {
            /* the last character fits in the truncation - we're fine */
            return len;
        }
        else
        {
            /* 
             *   the last character doesn't fit - truncate so that none of
             *   the last character's bytes are included 
             */
            return (last_ch - p);
        }
    }